

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_int_base.cpp
# Opt level: O1

bool __thiscall sc_dt::sc_int_base::xor_reduce(sc_int_base *this)

{
  byte bVar1;
  ulong uVar2;
  sbyte sVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  bVar1 = (byte)this->m_ulen;
  uVar2 = (ulong)(this->m_val << (bVar1 & 0x3f)) >> (bVar1 & 0x3f);
  uVar4 = 0x40;
  uVar5 = 0xffffffffffffffff;
  do {
    uVar4 = uVar4 >> 1;
    sVar3 = (sbyte)uVar4;
    uVar5 = uVar5 >> sVar3;
    uVar6 = (uVar5 << sVar3 & uVar2) >> sVar3;
    uVar7 = uVar2 & uVar5;
    uVar2 = uVar6 ^ uVar7;
  } while (uVar4 != 1);
  return uVar6 != uVar7;
}

Assistant:

bool
sc_int_base::xor_reduce() const
{
    uint_type mask = ~UINT_ZERO;
    uint_type val = m_val & (mask >> m_ulen);
    int n = SC_INTWIDTH;
    do {
	n >>= 1;
	mask >>= n;
	val = ((val & (mask << n)) >> n) ^ (val & mask);
    } while( n != 1 );
    return ( val != uint_type( 0 ) );
}